

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_biquad_config *
ma_biquad_config_init
          (ma_format format,ma_uint32 channels,double b0,double b1,double b2,double a0,double a1,
          double a2)

{
  ma_biquad_config *in_RDI;
  
  if (in_RDI != (ma_biquad_config *)0x0) {
    in_RDI->a0 = 0.0;
    in_RDI->a1 = 0.0;
    in_RDI->b1 = 0.0;
    in_RDI->b2 = 0.0;
    in_RDI->format = ma_format_unknown;
    in_RDI->channels = 0;
    in_RDI->b0 = 0.0;
    in_RDI->a2 = 0.0;
  }
  in_RDI->format = format;
  in_RDI->channels = channels;
  in_RDI->b0 = b0;
  in_RDI->b1 = b1;
  in_RDI->b2 = b2;
  in_RDI->a0 = a0;
  in_RDI->a1 = a1;
  in_RDI->a2 = a2;
  return in_RDI;
}

Assistant:

MA_API ma_biquad_config ma_biquad_config_init(ma_format format, ma_uint32 channels, double b0, double b1, double b2, double a0, double a1, double a2)
{
    ma_biquad_config config;

    MA_ZERO_OBJECT(&config);
    config.format = format;
    config.channels = channels;
    config.b0 = b0;
    config.b1 = b1;
    config.b2 = b2;
    config.a0 = a0;
    config.a1 = a1;
    config.a2 = a2;

    return config;
}